

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::input_stream_adapter::input_stream_adapter(input_stream_adapter *this,istream *i)

{
  int iVar1;
  int_type iVar2;
  streambuf *psVar3;
  int_type c;
  istream *i_local;
  input_stream_adapter *this_local;
  
  input_adapter_protocol::input_adapter_protocol(&this->super_input_adapter_protocol);
  (this->super_input_adapter_protocol)._vptr_input_adapter_protocol =
       (_func_int **)&PTR_get_character_002b28f8;
  this->is = i;
  psVar3 = (streambuf *)std::ios::rdbuf();
  this->sb = psVar3;
  iVar1 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)();
  if (iVar1 == 0xef) {
    iVar1 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)();
    if (iVar1 == 0xbb) {
      iVar1 = (**(this->super_input_adapter_protocol)._vptr_input_adapter_protocol)();
      if (iVar1 == 0xbf) {
        return;
      }
      iVar2 = std::char_traits<char>::eof();
      if (iVar1 != iVar2) {
        std::istream::unget();
      }
      std::istream::putback((char)this->is);
    }
    else {
      iVar2 = std::char_traits<char>::eof();
      if (iVar1 != iVar2) {
        std::istream::unget();
      }
    }
    std::istream::putback((char)this->is);
  }
  else {
    iVar2 = std::char_traits<char>::eof();
    if (iVar1 != iVar2) {
      std::istream::unget();
    }
  }
  return;
}

Assistant:

explicit input_stream_adapter(std::istream& i)
: is(i), sb(*i.rdbuf())
{
// skip byte order mark
std::char_traits<char>::int_type c;
if ((c = get_character()) == 0xEF)
{
if ((c = get_character()) == 0xBB)
{
if ((c = get_character()) == 0xBF)
{
return; // Ignore BOM
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xBB');
}
else if (c != std::char_traits<char>::eof())
{
is.unget();
}
is.putback('\xEF');
}
else if (c != std::char_traits<char>::eof())
{
is.unget(); // no byte order mark; process as usual
}
}